

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

ChebyshevExpansion *
ChebTools::ChebyshevExpansion::from_powxn
          (ChebyshevExpansion *__return_storage_ptr__,size_t n,double xmin,double xmax)

{
  Scalar *pSVar1;
  invalid_argument *this;
  long lVar2;
  ulong uVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  VectorXd c;
  ChebyshevExpansion local_70;
  undefined1 auVar7 [16];
  
  if ((xmin != -1.0) || (NAN(xmin))) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"xmin must be -1");
  }
  else {
    if ((xmax == 1.0) && (!NAN(xmax))) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
                ((ConstantReturnType *)&local_70,n + 1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&c,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_70);
      auVar7._8_4_ = (int)(n >> 0x20);
      auVar7._0_8_ = n;
      auVar7._12_4_ = 0x45300000;
      iVar4 = (int)n;
      uVar3 = n >> 1;
      for (lVar2 = 0; uVar3 + 1 != lVar2; lVar2 = lVar2 + 1) {
        pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&c,n);
        dVar5 = binomialCoefficient((auVar7._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0),
                                    (double)lVar2);
        dVar6 = dVar5 * 0.5;
        if (n != 0) {
          dVar6 = dVar5;
        }
        *pSVar1 = dVar6;
        n = n - 2;
      }
      dVar6 = ldexp(1.0,1 - iVar4);
      ChebyshevExpansion(&local_70,&c,-1.0,1.0);
      ChebTools::operator*(__return_storage_ptr__,dVar6,&local_70);
      ~ChebyshevExpansion(&local_70);
      free(c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      return __return_storage_ptr__;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"xmax must be 1");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::from_powxn(const std::size_t n, const double xmin, const double xmax) {
        if (xmin != -1) {
            throw std::invalid_argument("xmin must be -1");
        }
        if (xmax != 1) {
            throw std::invalid_argument("xmax must be 1");
        }
        Eigen::VectorXd c = Eigen::VectorXd::Zero(n + 1);
        for (std::size_t k = 0; k <= n / 2; ++k) {
            std::size_t index = n - 2 * k;
            double coeff = binomialCoefficient(static_cast<double>(n), static_cast<double>(k));
            if (index == 0) {
                coeff /= 2.0;
            }
            c(index) = coeff;
        }
        return pow(2, 1-static_cast<int>(n))*ChebyshevExpansion(c, xmin, xmax);
    }